

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O0

int __thiscall
ncnn::PriorBox::forward
          (PriorBox *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  float *pfVar4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  Allocator *in_RDI;
  double dVar5;
  int i_4;
  float *var;
  int i_3;
  float *box_3;
  float ar;
  int p_1;
  float max_size;
  float min_size;
  int k_1;
  float box_h;
  float box_w;
  int j_1;
  float center_y_1;
  float center_x_1;
  float *box_2;
  int i_2;
  Mat *top_blob;
  int num_prior;
  int num_aspect_ratio;
  int num_max_size;
  int num_min_size;
  float step_h;
  float step_w;
  int image_h;
  int image_w;
  int i_1;
  float *box_1;
  float ch_1;
  float cw_1;
  float ratio;
  int p;
  float size;
  float ch;
  float cw;
  float size_1;
  int k;
  int j;
  float center_y;
  float center_x;
  float *box;
  int i;
  Mat *top_blob_1;
  int num_prior_1;
  int num_ratios;
  int num_sizes;
  float step_h_1;
  float step_w_1;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffec0;
  float fVar6;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int iVar7;
  undefined8 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  float local_118;
  int local_114;
  float *local_110;
  float local_108;
  int local_104;
  float local_100;
  float local_fc;
  int local_f8;
  float local_f4;
  float local_f0;
  int local_ec;
  float local_e8;
  float local_e4;
  float *local_e0;
  int local_d4;
  reference local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  float local_b4;
  float local_b0;
  int local_ac;
  int local_a8;
  float local_a4;
  float local_a0;
  int local_9c;
  float *local_98;
  float local_90;
  float local_8c;
  float local_88;
  int local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  int local_70;
  int local_6c;
  float local_68;
  float local_64;
  float *local_60;
  int local_54;
  reference local_50;
  int local_44;
  int local_40;
  int local_3c;
  float local_38;
  float local_34;
  int local_30;
  int local_2c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_2c = pvVar2->w;
  pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
  local_30 = pvVar2->h;
  sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
  if ((((sVar3 == 1) && (*(int *)(in_RDI + 400) == -0xe9)) && (*(int *)(in_RDI + 0x194) == -0xe9))
     && (bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffec4,
                                                  in_stack_fffffffffffffec0)), bVar1)) {
    local_34 = *(float *)(in_RDI + 0x198);
    local_38 = *(float *)(in_RDI + 0x19c);
    if ((local_34 == -233.0) && (!NAN(local_34))) {
      local_34 = 1.0 / (float)local_2c;
    }
    if ((local_38 == -233.0) && (!NAN(local_38))) {
      local_38 = 1.0 / (float)local_30;
    }
    local_3c = *(int *)(in_RDI + 0xe4);
    local_40 = *(int *)(in_RDI + 0x164);
    local_44 = local_3c + -1 + local_40;
    local_50 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                      (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                      CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_RDI);
    bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    if (bVar1) {
      local_4 = -100;
    }
    else {
      for (local_54 = 0; local_54 < local_30; local_54 = local_54 + 1) {
        local_60 = ncnn::Mat::operator_cast_to_float_(local_50);
        local_60 = local_60 + local_54 * local_2c * local_44 * 4;
        local_64 = *(float *)(in_RDI + 0x1a0) * local_34;
        local_68 = *(float *)(in_RDI + 0x1a0) * local_38 + (float)local_54 * local_38;
        for (local_6c = 0; local_6c < local_2c; local_6c = local_6c + 1) {
          for (local_70 = 0; local_70 < local_3c; local_70 = local_70 + 1) {
            pfVar4 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xb8),(long)local_70);
            local_74 = *pfVar4;
            local_78 = ((local_74 * (float)local_30) / (float)local_2c) / 2.0;
            local_7c = local_74 / 2.0;
            *local_60 = local_64 - local_78;
            local_60[1] = local_68 - local_7c;
            local_60[2] = local_64 + local_78;
            local_60[3] = local_68 + local_7c;
            local_60 = local_60 + 4;
          }
          pfVar4 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xb8),0);
          local_80 = *pfVar4;
          for (local_84 = 1; local_84 < local_40; local_84 = local_84 + 1) {
            pfVar4 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x138),(long)local_84);
            dVar5 = std::sqrt((double)(ulong)(uint)*pfVar4);
            local_88 = SUB84(dVar5,0);
            local_8c = (((local_80 * (float)local_30) / (float)local_2c) * local_88) / 2.0;
            local_90 = (local_80 / local_88) / 2.0;
            *local_60 = local_64 - local_8c;
            local_60[1] = local_68 - local_90;
            local_60[2] = local_64 + local_8c;
            local_60[3] = local_68 + local_90;
            local_60 = local_60 + 4;
          }
          local_64 = local_34 + local_64;
        }
      }
      if (*(int *)(in_RDI + 0x18c) != 0) {
        local_98 = ncnn::Mat::operator_cast_to_float_(local_50);
        for (local_9c = 0; local_9c < local_50->w; local_9c = local_9c + 1) {
          local_a0 = 0.0;
          pfVar4 = std::max<float>(local_98 + local_9c,&local_a0);
          local_a4 = 1.0;
          pfVar4 = std::min<float>(pfVar4,&local_a4);
          local_98[local_9c] = *pfVar4;
        }
      }
      local_4 = 0;
    }
  }
  else {
    local_a8 = *(int *)(in_RDI + 400);
    local_ac = *(int *)(in_RDI + 0x194);
    if (local_a8 == -0xe9) {
      pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
      local_a8 = pvVar2->w;
    }
    if (local_ac == -0xe9) {
      pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
      local_ac = pvVar2->h;
    }
    local_b0 = *(float *)(in_RDI + 0x198);
    local_b4 = *(float *)(in_RDI + 0x19c);
    if (((local_b0 == -233.0) && (!NAN(local_b0))) &&
       (local_b0 = (float)local_a8 / (float)local_2c, ((byte)in_RDI[0x1a4] & 1) != 0)) {
      dVar5 = std::ceil((double)(ulong)(uint)((float)local_a8 / (float)local_2c));
      local_b0 = SUB84(dVar5,0);
    }
    if (((local_b4 == -233.0) && (!NAN(local_b4))) &&
       (local_b4 = (float)local_ac / (float)local_30, ((byte)in_RDI[0x1a4] & 1) != 0)) {
      dVar5 = std::ceil((double)(ulong)(uint)((float)local_ac / (float)local_30));
      local_b4 = SUB84(dVar5,0);
    }
    local_b8 = *(int *)(in_RDI + 0xe4);
    local_bc = *(int *)(in_RDI + 0x124);
    local_c0 = *(int *)(in_RDI + 0x164);
    local_c4 = local_b8 * local_c0 + local_b8 + local_bc;
    if (*(int *)(in_RDI + 0x188) != 0) {
      local_c4 = local_b8 * local_c0 + local_c4;
    }
    local_d0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                      (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8
                      ,CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_RDI);
    bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    if (bVar1) {
      local_4 = -100;
    }
    else {
      for (local_d4 = 0; local_d4 < local_30; local_d4 = local_d4 + 1) {
        local_e0 = ncnn::Mat::operator_cast_to_float_(local_d0);
        local_e0 = local_e0 + local_d4 * local_2c * local_c4 * 4;
        local_e4 = *(float *)(in_RDI + 0x1a0) * local_b0;
        local_e8 = *(float *)(in_RDI + 0x1a0) * local_b4 + (float)local_d4 * local_b4;
        if (((byte)in_RDI[0x1a5] & 1) != 0) {
          local_e4 = *(float *)(in_RDI + 0x1a0) * (local_b0 - 1.0);
          local_e8 = *(float *)(in_RDI + 0x1a0) * (local_b4 - 1.0) + (float)local_d4 * local_b4;
        }
        for (local_ec = 0; local_ec < local_2c; local_ec = local_ec + 1) {
          for (local_f8 = 0; local_f8 < local_b8; local_f8 = local_f8 + 1) {
            pfVar4 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xb8),(long)local_f8);
            local_fc = *pfVar4;
            *local_e0 = (local_e4 - local_fc * 0.5) / (float)local_a8;
            local_e0[1] = (local_e8 - local_fc * 0.5) / (float)local_ac;
            local_e0[2] = (local_e4 + local_fc * 0.5) / (float)local_a8;
            local_e0[3] = (local_e8 + local_fc * 0.5) / (float)local_ac;
            local_e0 = local_e0 + 4;
            local_f0 = local_fc;
            if (0 < local_bc) {
              local_f4 = local_fc;
              pfVar4 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xf8),(long)local_f8);
              local_100 = *pfVar4;
              dVar5 = std::sqrt((double)(ulong)(uint)(local_fc * local_100));
              local_f0 = SUB84(dVar5,0);
              *local_e0 = (local_e4 - local_f0 * 0.5) / (float)local_a8;
              local_e0[1] = (local_e8 - local_f0 * 0.5) / (float)local_ac;
              local_e0[2] = (local_e4 + local_f0 * 0.5) / (float)local_a8;
              local_e0[3] = (local_e8 + local_f0 * 0.5) / (float)local_ac;
              local_e0 = local_e0 + 4;
            }
            local_f4 = local_f0;
            for (local_104 = 0; local_104 < local_c0; local_104 = local_104 + 1) {
              pfVar4 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x138),(long)local_104);
              local_108 = *pfVar4;
              fVar6 = local_fc;
              dVar5 = std::sqrt((double)(ulong)(uint)local_108);
              local_f0 = fVar6 * SUB84(dVar5,0);
              fVar6 = local_fc;
              dVar5 = std::sqrt((double)(ulong)(uint)local_108);
              local_f4 = fVar6 / SUB84(dVar5,0);
              *local_e0 = (local_e4 - local_f0 * 0.5) / (float)local_a8;
              local_e0[1] = (local_e8 - local_f4 * 0.5) / (float)local_ac;
              local_e0[2] = (local_e4 + local_f0 * 0.5) / (float)local_a8;
              local_e0[3] = (local_e8 + local_f4 * 0.5) / (float)local_ac;
              pfVar4 = local_e0 + 4;
              if (*(int *)(in_RDI + 0x188) != 0) {
                local_e0[4] = (local_e4 - local_f4 * 0.5) / (float)local_a8;
                local_e0[5] = (local_e8 - local_f0 * 0.5) / (float)local_ac;
                local_e0[6] = (local_e4 + local_f4 * 0.5) / (float)local_a8;
                local_e0[7] = (local_e8 + local_f0 * 0.5) / (float)local_ac;
                pfVar4 = local_e0 + 8;
              }
              local_e0 = pfVar4;
            }
          }
          local_e4 = local_b0 + local_e4;
        }
      }
      if (*(int *)(in_RDI + 0x18c) != 0) {
        local_110 = ncnn::Mat::operator_cast_to_float_(local_d0);
        for (local_114 = 0; local_114 < local_d0->w; local_114 = local_114 + 1) {
          local_118 = 0.0;
          pfVar4 = std::max<float>(local_110 + local_114,&local_118);
          pfVar4 = std::min<float>(pfVar4,(float *)&stack0xfffffffffffffee4);
          local_110[local_114] = *pfVar4;
        }
      }
      pfVar4 = ncnn::Mat::row(local_d0,1);
      for (iVar7 = 0; iVar7 < local_d0->w / 4; iVar7 = iVar7 + 1) {
        *pfVar4 = *(float *)(in_RDI + 0x178);
        pfVar4[1] = *(float *)(in_RDI + 0x17c);
        pfVar4[2] = *(float *)(in_RDI + 0x180);
        pfVar4[3] = *(float *)(in_RDI + 0x184);
        pfVar4 = pfVar4 + 4;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int PriorBox::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int w = bottom_blobs[0].w;
    int h = bottom_blobs[0].h;

    if (bottom_blobs.size() == 1 && image_width == -233 && image_height == -233 && max_sizes.empty())
    {
        // mxnet style _contrib_MultiBoxPrior
        float step_w = step_width;
        float step_h = step_height;
        if (step_w == -233)
            step_w = 1.f / (float)w;
        if (step_h == -233)
            step_h = 1.f / (float)h;

        int num_sizes = min_sizes.w;
        int num_ratios = aspect_ratios.w;

        int num_prior = num_sizes - 1 + num_ratios;

        Mat& top_blob = top_blobs[0];
        top_blob.create(4 * w * h * num_prior, 4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* box = (float*)top_blob + i * w * num_prior * 4;

            float center_x = offset * step_w;
            float center_y = offset * step_h + i * step_h;

            for (int j = 0; j < w; j++)
            {
                // ratio = 1, various sizes
                for (int k = 0; k < num_sizes; k++)
                {
                    float size = min_sizes[k];
                    float cw = size * h / w / 2;
                    float ch = size / 2;

                    box[0] = center_x - cw;
                    box[1] = center_y - ch;
                    box[2] = center_x + cw;
                    box[3] = center_y + ch;
                    box += 4;
                }

                // various ratios, size = min_size = size[0]
                float size = min_sizes[0];
                for (int p = 1; p < num_ratios; p++)
                {
                    float ratio = static_cast<float>(sqrt(aspect_ratios[p]));
                    float cw = size * h / w * ratio / 2;
                    float ch = size / ratio / 2;

                    box[0] = center_x - cw;
                    box[1] = center_y - ch;
                    box[2] = center_x + cw;
                    box[3] = center_y + ch;
                    box += 4;
                }

                center_x += step_w;
            }
        }

        if (clip)
        {
            float* box = top_blob;
            for (int i = 0; i < top_blob.w; i++)
            {
                box[i] = std::min(std::max(box[i], 0.f), 1.f);
            }
        }

        return 0;
    }

    int image_w = image_width;
    int image_h = image_height;
    if (image_w == -233)
        image_w = bottom_blobs[1].w;
    if (image_h == -233)
        image_h = bottom_blobs[1].h;

    float step_w = step_width;
    float step_h = step_height;
    if (step_w == -233)
    {
        step_w = (float)image_w / w;
        if (step_mmdetection)
            step_w = static_cast<float>(ceil((float)image_w / w));
    }
    if (step_h == -233)
    {
        step_h = (float)image_h / h;
        if (step_mmdetection)
            step_h = static_cast<float>(ceil((float)image_h / h));
    }

    int num_min_size = min_sizes.w;
    int num_max_size = max_sizes.w;
    int num_aspect_ratio = aspect_ratios.w;

    int num_prior = num_min_size * num_aspect_ratio + num_min_size + num_max_size;
    if (flip)
        num_prior += num_min_size * num_aspect_ratio;

    Mat& top_blob = top_blobs[0];
    top_blob.create(4 * w * h * num_prior, 2, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < h; i++)
    {
        float* box = (float*)top_blob + i * w * num_prior * 4;

        float center_x = offset * step_w;
        float center_y = offset * step_h + i * step_h;
        if (center_mmdetection) 
        {
            center_x = offset * (step_w - 1);
            center_y = offset * (step_h - 1) + i * step_h;
        }

        for (int j = 0; j < w; j++)
        {
            float box_w;
            float box_h;

            for (int k = 0; k < num_min_size; k++)
            {
                float min_size = min_sizes[k];

                // min size box
                box_w = box_h = min_size;

                box[0] = (center_x - box_w * 0.5f) / image_w;
                box[1] = (center_y - box_h * 0.5f) / image_h;
                box[2] = (center_x + box_w * 0.5f) / image_w;
                box[3] = (center_y + box_h * 0.5f) / image_h;

                box += 4;

                if (num_max_size > 0)
                {
                    float max_size = max_sizes[k];

                    // max size box
                    box_w = box_h = static_cast<float>(sqrt(min_size * max_size));

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;
                }

                // all aspect_ratios
                for (int p = 0; p < num_aspect_ratio; p++)
                {
                    float ar = aspect_ratios[p];

                    box_w = static_cast<float>(min_size * sqrt(ar));
                    box_h = static_cast<float>(min_size / sqrt(ar));

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;

                    if (flip)
                    {
                        box[0] = (center_x - box_h * 0.5f) / image_w;
                        box[1] = (center_y - box_w * 0.5f) / image_h;
                        box[2] = (center_x + box_h * 0.5f) / image_w;
                        box[3] = (center_y + box_w * 0.5f) / image_h;

                        box += 4;
                    }
                }
            }

            center_x += step_w;
        }
    }

    if (clip)
    {
        float* box = top_blob;
        for (int i = 0; i < top_blob.w; i++)
        {
            box[i] = std::min(std::max(box[i], 0.f), 1.f);
        }
    }

    // set variance
    float* var = top_blob.row(1);
    for (int i = 0; i < top_blob.w / 4; i++)
    {
        var[0] = variances[0];
        var[1] = variances[1];
        var[2] = variances[2];
        var[3] = variances[3];

        var += 4;
    }

    return 0;
}